

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_rg_etc1.cpp
# Opt level: O0

uint crnlib::rg_etc1::etc1_decode_value(uint diff,uint inten,uint selector,uint packed_c)

{
  uint uVar1;
  uint local_1c;
  int c;
  uint packed_c_local;
  uint selector_local;
  uint inten_local;
  uint diff_local;
  
  if (diff == 0) {
    local_1c = packed_c | packed_c << 4;
  }
  else {
    local_1c = packed_c >> 2 | packed_c << 3;
  }
  uVar1 = clamp<int>(*(int *)(g_etc1_inten_tables + (ulong)selector * 4 + (ulong)inten * 0x10) +
                     local_1c,0,0xff);
  return uVar1;
}

Assistant:

static uint etc1_decode_value(uint diff, uint inten, uint selector, uint packed_c)
        {
            RG_ETC1_ASSERT((diff < 2) && (inten < 8) && (selector < 4) && (packed_c < (diff ? 32 : 16)));
            int c;
            if (diff)
            {
                c = (packed_c >> 2) | (packed_c << 3);
            }
            else
            {
                c = packed_c | (packed_c << 4);
            }
            c += g_etc1_inten_tables[inten][selector];
            c = rg_etc1::clamp<int>(c, 0, 255);
            return c;
        }